

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void delete_list(void)

{
  node *pnVar1;
  node *__ptr;
  
  __ptr = first;
  while (__ptr != (node *)0x0) {
    pnVar1 = __ptr->next;
    free(__ptr);
    __ptr = pnVar1;
  }
  first = (node *)0x0;
  return;
}

Assistant:

void delete_list() {
    struct node *temp;
    struct node *node = first;
    while (node != NULL) {
        temp = node;
        node = node->next;
        free(temp);
    }
    first = NULL;
}